

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

void __thiscall VertexClustering::input(VertexClustering *this,string *filePath)

{
  VCFace *pVVar1;
  bool bVar2;
  char *pcVar3;
  FILE *__stream;
  ostream *this_00;
  pointer ppVar4;
  pointer this_01;
  double *in_RDI;
  iterator e;
  iterator iter;
  int i;
  VCPair pairs [3];
  VCFace *f_1;
  int c;
  int b;
  int a;
  double z;
  double y;
  double x;
  vector<VCFace_*,_std::allocator<VCFace_*>_> faces;
  vector<VCEdge,_std::allocator<VCEdge>_> edges;
  char _;
  char s [256];
  int cntf;
  int cntv;
  FILE *f;
  vector<VCFace_*,_std::allocator<VCFace_*>_> *in_stack_00000428;
  VertexClustering *in_stack_00000430;
  Vertex *in_stack_fffffffffffffd28;
  VertexGroup *in_stack_fffffffffffffd30;
  VCFace *in_stack_fffffffffffffd38;
  VCFace *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
  *in_stack_fffffffffffffd70;
  VCFace *in_stack_fffffffffffffd78;
  Vertex *in_stack_fffffffffffffd80;
  __normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_> local_238;
  VCEdge local_230;
  _Self local_220;
  _Self local_218;
  int local_20c;
  VCPair local_208;
  VCPair local_200;
  VCPair local_1f8;
  VCFace *local_1f0;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  double local_188;
  double local_180;
  double local_178 [9];
  undefined1 local_129;
  char local_128 [200];
  VCCluster *in_stack_ffffffffffffffa0;
  VertexGroup *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  VCFace *in_stack_ffffffffffffffc0;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar3,"r");
  std::vector<VCEdge,_std::allocator<VCEdge>_>::vector
            ((vector<VCEdge,_std::allocator<VCEdge>_> *)0x2801ce);
  std::vector<VCFace_*,_std::allocator<VCFace_*>_>::vector
            ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)0x2801db);
  while (pcVar3 = fgets(local_128,0x100,__stream), pcVar3 != (char *)0x0) {
    if (local_128[0] != '#') {
      if (local_128[0] == 'f') {
        in_RDI[0x15] = (double)((long)in_RDI[0x15] + 1);
        in_stack_fffffffffffffd80 = (Vertex *)&stack0xfffffffffffffe24;
        __isoc99_sscanf(local_128,"%c%d%d%d",&local_129);
        VCSort3<int>((int *)in_stack_fffffffffffffd30,&in_stack_fffffffffffffd28->id,(int *)0x28042a
                    );
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        Vertex::addNeighborVertex
                  ((Vertex *)in_stack_fffffffffffffd40,
                   (int)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        in_stack_fffffffffffffd6c = in_stack_fffffffffffffe1c;
        in_stack_fffffffffffffd68 = in_stack_fffffffffffffe20;
        in_stack_fffffffffffffd78 = (VCFace *)operator_new(0x150);
        in_stack_fffffffffffffd70 =
             (map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
              *)*in_RDI;
        in_stack_fffffffffffffe1c = in_stack_fffffffffffffd6c;
        in_stack_fffffffffffffe20 = in_stack_fffffffffffffd68;
        std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::operator[]
                  ((vector<VCCluster_*,_std::allocator<VCCluster_*>_> *)(in_RDI + 2),0);
        VCFace::VCFace(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                       ,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa0);
        local_1f0 = in_stack_fffffffffffffd78;
        std::vector<VCFace_*,_std::allocator<VCFace_*>_>::push_back
                  ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_fffffffffffffd40,
                   (value_type *)in_stack_fffffffffffffd38);
        VCPair::VCPair(&local_208,in_stack_fffffffffffffe24,in_stack_fffffffffffffe20);
        VCPair::VCPair(&local_200,in_stack_fffffffffffffe24,in_stack_fffffffffffffe1c);
        VCPair::VCPair(&local_1f8,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        for (local_20c = 0; local_20c < 3; local_20c = local_20c + 1) {
          local_218._M_node =
               (_Base_ptr)
               std::
               map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
               ::find((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                       *)in_stack_fffffffffffffd28,(key_type *)0x280658);
          local_220._M_node =
               (_Base_ptr)
               std::
               map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
               ::end((map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                      *)in_stack_fffffffffffffd28);
          bVar2 = std::operator!=(&local_218,&local_220);
          pVVar1 = local_1f0;
          if (bVar2) {
            ppVar4 = std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                               ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x2806c2);
            (ppVar4->second).f2 = pVVar1;
            std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x2806d5);
            VCFace::addNeighbor(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            in_stack_fffffffffffffd40 = local_1f0;
            std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x280702);
            VCFace::addNeighbor(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            std::_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_VCPair,_VCEdge>_> *)0x28071f);
            std::vector<VCEdge,_std::allocator<VCEdge>_>::push_back
                      ((vector<VCEdge,_std::allocator<VCEdge>_> *)in_stack_fffffffffffffd40,
                       (value_type *)in_stack_fffffffffffffd38);
          }
          else {
            VCEdge::VCEdge(&local_230,local_1f0,(VCFace *)0x0);
            in_stack_fffffffffffffd38 =
                 (VCFace *)
                 std::
                 map<VCPair,_VCEdge,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                 ::operator[](in_stack_fffffffffffffd70,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
            *(VCFace **)in_stack_fffffffffffffd38 = local_230.f1;
            *(VCFace **)&in_stack_fffffffffffffd38->v3 = local_230.f2;
          }
        }
      }
      else if (local_128[0] == 'v') {
        __isoc99_sscanf(local_128,"%c%lf%lf%lf",&local_129,local_178,&local_180,&local_188);
        if (((NAN(local_178[0])) || (NAN(local_180))) || (NAN(local_188))) {
          this_00 = std::operator<<((ostream *)&std::cout,"warning: nan vertex in input");
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
        Vertex::Vertex(in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78,
                       (double)in_stack_fffffffffffffd70,
                       (double)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        VertexGroup::addVertex(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        Vertex::~Vertex((Vertex *)in_stack_fffffffffffffd30);
      }
    }
  }
  if (((ulong)in_RDI[0x19] & 1) != 0) {
    calcCurvature(in_stack_00000430,in_stack_00000428);
  }
  initClusters((VertexClustering *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (vector<VCEdge,_std::allocator<VCEdge>_> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_238._M_current =
       (VCEdge *)
       std::vector<VCEdge,_std::allocator<VCEdge>_>::begin
                 ((vector<VCEdge,_std::allocator<VCEdge>_> *)in_stack_fffffffffffffd28);
  while( true ) {
    std::vector<VCEdge,_std::allocator<VCEdge>_>::end
              ((vector<VCEdge,_std::allocator<VCEdge>_> *)in_stack_fffffffffffffd28);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_> *
                       )in_stack_fffffffffffffd30,
                       (__normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_> *
                       )in_stack_fffffffffffffd28);
    if (!bVar2) break;
    this_01 = __gnu_cxx::__normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_>
              ::operator->(&local_238);
    bVar2 = VCEdge::isBoundary(this_01);
    if (bVar2) {
      in_stack_fffffffffffffd30 = (VertexGroup *)(in_RDI + 0xb);
      __gnu_cxx::__normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_>::
      operator*(&local_238);
      std::queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_>::push
                ((queue<VCEdge,_std::deque<VCEdge,_std::allocator<VCEdge>_>_> *)
                 in_stack_fffffffffffffd30,(value_type *)in_stack_fffffffffffffd28);
    }
    __gnu_cxx::__normal_iterator<VCEdge_*,_std::vector<VCEdge,_std::allocator<VCEdge>_>_>::
    operator++(&local_238);
  }
  std::vector<VCFace_*,_std::allocator<VCFace_*>_>::~vector
            ((vector<VCFace_*,_std::allocator<VCFace_*>_> *)in_stack_fffffffffffffd40);
  std::vector<VCEdge,_std::allocator<VCEdge>_>::~vector
            ((vector<VCEdge,_std::allocator<VCEdge>_> *)in_stack_fffffffffffffd40);
  return;
}

Assistant:

void VertexClustering::input(const string& filePath)
{
	FILE* f = fopen(filePath.c_str(), "r");
	int cntv = 0, cntf = 0;
	char s[256], _;
	vector<VCEdge> edges;
	vector<VCFace *> faces;

	while (fgets(s, sizeof s, f) != NULL) {
		switch (s[0]) {
		case '#': break; 
		case 'v': {
			cntv++;
			double x, y, z;
			sscanf(s, "%c%lf%lf%lf", &_, &x, &y, &z);
			if (x != x || y != y || z != z) {
				cout << "warning: nan vertex in input" << endl;
			}
			vGroup->addVertex(Vertex(x, y, z));
			break;
		}
		case 'f': {
			cntf++;
			cntFace++;
			int a, b, c;
			sscanf(s, "%c%d%d%d",&_, &a, &b, &c);
			VCSort3(a, b, c);
			vGroup->group[a].addNeighborVertex(b);
			vGroup->group[a].addNeighborVertex(c);
			vGroup->group[b].addNeighborVertex(a);
			vGroup->group[b].addNeighborVertex(c);
			vGroup->group[c].addNeighborVertex(a);
			vGroup->group[c].addNeighborVertex(b);
			VCFace* f = new VCFace(a, b, c, vGroup, clusters[0]); //face pointers tracked by clusters
			faces.push_back(f);
			VCPair pairs[3] = { VCPair(a,b), VCPair(a,c), VCPair(b,c) };
			for (int i = 0; i < 3; ++i) {
				auto iter = edgeMap.find(pairs[i]);
				if (iter != edgeMap.end()) {
					iter->second.f2 = f;
					iter->second.f1->addNeighbor(f);
					f->addNeighbor(iter->second.f1);
					edges.push_back(iter->second);
				}
				else {
					edgeMap[pairs[i]] = VCEdge(f, NULL);
				}
			}
			break;
		}
		default: break;
		}
	}
	if(opts.adaptive)
		calcCurvature(faces); //only uniform remeshing can skip this step
	initClusters(edges);
	for (auto e = edges.begin(); e != edges.end(); ++e) {
		if (e->isBoundary())
			boundary.push(*e);
	}
}